

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

int __thiscall QTextDocumentPrivate::init(QTextDocumentPrivate *this,EVP_PKEY_CTX *ctx)

{
  QTextFormatCollection *this_00;
  bool bVar1;
  int iVar2;
  int charFormat;
  long in_FS_OFFSET;
  QTextFormat QStack_58;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->framesDirty = false;
  bVar1 = this->undoEnabled;
  this->undoEnabled = false;
  this_00 = &this->formats;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_48);
  iVar2 = QTextFormatCollection::indexForFormat(this_00,&local_48);
  this->initialBlockCharFormatIndex = iVar2;
  QTextFormat::~QTextFormat(&local_48);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_48);
  iVar2 = QTextFormatCollection::indexForFormat(this_00,&local_48);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&QStack_58);
  charFormat = QTextFormatCollection::indexForFormat(this_00,&QStack_58);
  insertBlock(this,(QChar)0x2029,0,iVar2,charFormat,MoveCursor);
  QTextFormat::~QTextFormat(&QStack_58);
  QTextFormat::~QTextFormat(&local_48);
  this->undoEnabled = bVar1;
  this->modified = false;
  this->modifiedState = 0;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::init()
{
    framesDirty = false;

    bool undoState = undoEnabled;
    undoEnabled = false;
    initialBlockCharFormatIndex = formats.indexForFormat(QTextCharFormat());
    insertBlock(0, formats.indexForFormat(QTextBlockFormat()), formats.indexForFormat(QTextCharFormat()));
    undoEnabled = undoState;
    modified = false;
    modifiedState = 0;

    qRegisterMetaType<QTextDocument *>();
}